

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv_c.cpp
# Opt level: O3

dxil_spv_result dxil_spv_parse_dxil_blob(void *data,size_t size,dxil_spv_parsed_blob *blob)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
  *paVar1;
  pointer puVar2;
  pointer pcVar3;
  pointer puVar4;
  pointer pRVar5;
  bool bVar6;
  dxil_spv_parsed_blob this;
  Vector<uint8_t> *pVVar7;
  Vector<RDATSubobject> *pVVar8;
  LLVMBCParser *parser_00;
  dxil_spv_result dVar9;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *name;
  pointer entry;
  Vector<String> names;
  DXILContainerParser parser;
  Vector<String> local_1b0;
  DXILContainerParser local_198;
  undefined1 local_138 [32];
  String local_118;
  NodeInputData local_f8;
  Vector<NodeOutputData> local_50;
  
  this = (dxil_spv_parsed_blob)operator_new(0x70,(nothrow_t *)&std::nothrow);
  if (this == (dxil_spv_parsed_blob)0x0) {
    return DXIL_SPV_ERROR_OUT_OF_MEMORY;
  }
  dxil_spv::LLVMBCParser::LLVMBCParser((LLVMBCParser *)this);
  paVar1 = &(this->disasm).field_2;
  (this->disasm)._M_dataplus._M_p = (pointer)paVar1;
  (this->disasm)._M_string_length = 0;
  (this->disasm).field_2._M_local_buf[0] = '\0';
  (this->dxil_blob).
  super__Vector_base<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dxil_blob).
  super__Vector_base<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dxil_blob).
  super__Vector_base<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rdat_subobjects).
  super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rdat_subobjects).
  super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rdat_subobjects).
  super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->entry_points).
  super__Vector_base<dxil_spv_parsed_blob_s::EntryPoint,_dxil_spv::ThreadLocalAllocator<dxil_spv_parsed_blob_s::EntryPoint>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->entry_points).
  super__Vector_base<dxil_spv_parsed_blob_s::EntryPoint,_dxil_spv::ThreadLocalAllocator<dxil_spv_parsed_blob_s::EntryPoint>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->entry_points).
  super__Vector_base<dxil_spv_parsed_blob_s::EntryPoint,_dxil_spv::ThreadLocalAllocator<dxil_spv_parsed_blob_s::EntryPoint>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198.rdat_subobjects.
  super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.rdat_subobjects.
  super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198.output_elements.
  super__Vector_base<DXIL::IOElement,_dxil_spv::ThreadLocalAllocator<DXIL::IOElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198.rdat_subobjects.
  super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.output_elements.
  super__Vector_base<DXIL::IOElement,_dxil_spv::ThreadLocalAllocator<DXIL::IOElement>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.output_elements.
  super__Vector_base<DXIL::IOElement,_dxil_spv::ThreadLocalAllocator<DXIL::IOElement>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.input_elements.
  super__Vector_base<DXIL::IOElement,_dxil_spv::ThreadLocalAllocator<DXIL::IOElement>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.input_elements.
  super__Vector_base<DXIL::IOElement,_dxil_spv::ThreadLocalAllocator<DXIL::IOElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198.dxil_blob.
  super__Vector_base<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198.input_elements.
  super__Vector_base<DXIL::IOElement,_dxil_spv::ThreadLocalAllocator<DXIL::IOElement>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.dxil_blob.
  super__Vector_base<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.dxil_blob.
  super__Vector_base<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar6 = dxil_spv::DXILContainerParser::parse_container(&local_198,data,size,false);
  if (bVar6) {
    pVVar7 = dxil_spv::DXILContainerParser::get_blob(&local_198);
    puVar2 = (this->dxil_blob).
             super__Vector_base<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar4 = (pVVar7->
             super__Vector_base<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    (this->dxil_blob).
    super__Vector_base<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pVVar7->super__Vector_base<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>)
         ._M_impl.super__Vector_impl_data._M_start;
    (this->dxil_blob).
    super__Vector_base<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar4;
    (this->dxil_blob).
    super__Vector_base<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pVVar7->super__Vector_base<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>)
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (pVVar7->super__Vector_base<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pVVar7->super__Vector_base<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pVVar7->super__Vector_base<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar2 != (pointer)0x0) {
      dxil_spv::free_in_thread(puVar2);
    }
    pVVar8 = dxil_spv::DXILContainerParser::get_rdat_subobjects(&local_198);
    local_138._16_8_ =
         (this->rdat_subobjects).
         super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pRVar5 = (pVVar8->
             super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    local_138._0_8_ =
         (this->rdat_subobjects).
         super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_138._8_8_ =
         (this->rdat_subobjects).
         super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (this->rdat_subobjects).
    super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pVVar8->
         super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
         )._M_impl.super__Vector_impl_data._M_start;
    (this->rdat_subobjects).
    super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
    ._M_impl.super__Vector_impl_data._M_finish = pRVar5;
    (this->rdat_subobjects).
    super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pVVar8->
         super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
         )._M_impl.super__Vector_impl_data._M_end_of_storage;
    (pVVar8->
    super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pVVar8->
    super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pVVar8->
    super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>::
    ~vector((vector<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
             *)local_138);
    puVar2 = (this->dxil_blob).
             super__Vector_base<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    bVar6 = dxil_spv::LLVMBCParser::parse
                      ((LLVMBCParser *)this,puVar2,
                       (long)(this->dxil_blob).
                             super__Vector_base<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
    if (bVar6) {
      dxil_spv::Converter::get_entry_points_abi_cxx11_(&local_1b0,(Converter *)this,parser_00);
      if (local_1b0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_1b0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        entry = local_1b0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_138._0_8_ = local_138 + 0x10;
          pcVar3 = (entry->_M_dataplus)._M_p;
          std::__cxx11::
          basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>::
          _M_construct<char*>((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>
                               *)local_138,pcVar3,pcVar3 + entry->_M_string_length);
          dxil_spv::demangle_entry_point(&local_118,entry);
          dxil_spv::Converter::get_node_input
                    (&local_f8,(LLVMBCParser *)this,(entry->_M_dataplus)._M_p);
          dxil_spv::Converter::get_node_outputs
                    (&local_50,(LLVMBCParser *)this,(entry->_M_dataplus)._M_p);
          std::
          vector<dxil_spv_parsed_blob_s::EntryPoint,_dxil_spv::ThreadLocalAllocator<dxil_spv_parsed_blob_s::EntryPoint>_>
          ::emplace_back<dxil_spv_parsed_blob_s::EntryPoint>
                    (&this->entry_points,(EntryPoint *)local_138);
          std::
          vector<dxil_spv::NodeOutputData,_dxil_spv::ThreadLocalAllocator<dxil_spv::NodeOutputData>_>
          ::~vector(&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
               *)local_f8.node_share_input_id._M_dataplus._M_p !=
              &local_f8.node_share_input_id.field_2) {
            dxil_spv::free_in_thread(local_f8.node_share_input_id._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
               *)local_f8.node_id._M_dataplus._M_p != &local_f8.node_id.field_2) {
            dxil_spv::free_in_thread(local_f8.node_id._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            dxil_spv::free_in_thread(local_118._M_dataplus._M_p);
          }
          if ((pointer)local_138._0_8_ != (pointer)(local_138 + 0x10)) {
            dxil_spv::free_in_thread((void *)local_138._0_8_);
          }
          entry = entry + 1;
        } while (entry != local_1b0.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
      }
      *blob = this;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
      ::~vector(&local_1b0);
      dVar9 = DXIL_SPV_SUCCESS;
      goto LAB_0010b230;
    }
    std::
    vector<dxil_spv_parsed_blob_s::EntryPoint,_dxil_spv::ThreadLocalAllocator<dxil_spv_parsed_blob_s::EntryPoint>_>
    ::~vector(&this->entry_points);
  }
  else {
    std::
    vector<dxil_spv_parsed_blob_s::EntryPoint,_dxil_spv::ThreadLocalAllocator<dxil_spv_parsed_blob_s::EntryPoint>_>
    ::~vector(&this->entry_points);
  }
  std::vector<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>::
  ~vector(&this->rdat_subobjects);
  puVar2 = (this->dxil_blob).
           super__Vector_base<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    dxil_spv::free_in_thread(puVar2);
  }
  pcVar3 = (this->disasm)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
       *)pcVar3 != paVar1) {
    dxil_spv::free_in_thread(pcVar3);
  }
  dxil_spv::LLVMBCParser::~LLVMBCParser((LLVMBCParser *)this);
  operator_delete(this,0x70);
  dVar9 = DXIL_SPV_ERROR_PARSER;
LAB_0010b230:
  std::vector<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>::
  ~vector(&local_198.rdat_subobjects);
  std::vector<DXIL::IOElement,_dxil_spv::ThreadLocalAllocator<DXIL::IOElement>_>::~vector
            (&local_198.output_elements);
  std::vector<DXIL::IOElement,_dxil_spv::ThreadLocalAllocator<DXIL::IOElement>_>::~vector
            (&local_198.input_elements);
  if (local_198.dxil_blob.
      super__Vector_base<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    dxil_spv::free_in_thread
              (local_198.dxil_blob.
               super__Vector_base<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start);
  }
  return dVar9;
}

Assistant:

dxil_spv_result dxil_spv_parse_dxil_blob(const void *data, size_t size, dxil_spv_parsed_blob *blob)
{
	auto *parsed = new (std::nothrow) dxil_spv_parsed_blob_s;
	if (!parsed)
		return DXIL_SPV_ERROR_OUT_OF_MEMORY;

	DXILContainerParser parser;
	if (!parser.parse_container(data, size, false))
	{
		delete parsed;
		return DXIL_SPV_ERROR_PARSER;
	}

	parsed->dxil_blob = std::move(parser.get_blob());
	parsed->rdat_subobjects = std::move(parser.get_rdat_subobjects());

	if (!parsed->bc.parse(parsed->dxil_blob.data(), parsed->dxil_blob.size()))
	{
		delete parsed;
		return DXIL_SPV_ERROR_PARSER;
	}

	auto names = Converter::get_entry_points(parsed->bc);
	for (auto &name : names)
	{
		parsed->entry_points.push_back({
			name, demangle_entry_point(name),
			Converter::get_node_input(parsed->bc, name.c_str()),
			Converter::get_node_outputs(parsed->bc, name.c_str())
		});
	}

	*blob = parsed;
	return DXIL_SPV_SUCCESS;
}